

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::MeshEdgebreakerTraversalDecoder
          (MeshEdgebreakerTraversalDecoder *this)

{
  DecoderBuffer *in_RDI;
  DecoderBuffer *pDVar1;
  
  DecoderBuffer::DecoderBuffer(in_RDI);
  DecoderBuffer::DecoderBuffer(in_RDI);
  pDVar1 = in_RDI + 2;
  RAnsBitDecoder::RAnsBitDecoder((RAnsBitDecoder *)in_RDI);
  DecoderBuffer::DecoderBuffer(in_RDI);
  std::unique_ptr<draco::RAnsBitDecoder[],std::default_delete<draco::RAnsBitDecoder[]>>::
  unique_ptr<std::default_delete<draco::RAnsBitDecoder[]>,void>
            ((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_> *)
             in_RDI,pDVar1);
  *(undefined4 *)&in_RDI[3].bit_decoder_.bit_buffer_end_ = 0;
  in_RDI[3].bit_decoder_.bit_offset_ = 0;
  return;
}

Assistant:

MeshEdgebreakerTraversalDecoder()
      : attribute_connectivity_decoders_(nullptr),
        num_attribute_data_(0),
        decoder_impl_(nullptr) {}